

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall
Pubkey_ConstructorTest_Test::~Pubkey_ConstructorTest_Test(Pubkey_ConstructorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Pubkey, ConstructorTest) {
  for (PubkeyTestVector test_vector : pubkey_test_vectors) {
    // hex string constructor
    Pubkey pubkey = Pubkey(test_vector.hex);
    pubkeyFieldTest(pubkey, test_vector);
    // ByteData constructor
    pubkey = Pubkey(ByteData(test_vector.hex));
    pubkeyFieldTest(pubkey, test_vector);
    if (test_vector.parity) {
      EXPECT_TRUE(pubkey.IsParity());
    } else {
      EXPECT_FALSE(pubkey.IsParity());
    }
  }
}